

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O0

void idct32_stage7_avx2(__m256i *bf1,__m256i *cospim32,__m256i *cospi32,__m256i *clamp_lo,
                       __m256i *clamp_hi,__m256i *rounding,int bit)

{
  __m256i in1;
  __m256i in1_00;
  __m256i in1_01;
  __m256i in1_02;
  __m256i in1_03;
  __m256i in1_04;
  __m256i in1_05;
  __m256i in1_06;
  __m256i in1_07;
  __m256i in1_08;
  __m256i in1_09;
  __m256i in1_10;
  __m256i *in_RCX;
  __m256i *in_RDX;
  __m256i *in_RSI;
  __m256i *in_RDI;
  __m256i *in_R8;
  __m256i *in_R9;
  longlong lVar1;
  longlong lVar2;
  longlong lVar3;
  longlong lVar4;
  longlong lVar5;
  longlong lVar6;
  __m256i *palVar7;
  __m256i *palVar8;
  __m256i temp1;
  __m256i *in_stack_ffffffffffffff98;
  __m256i *clamp_hi_00;
  __m256i *in_stack_ffffffffffffffd0;
  __m256i in_stack_ffffffffffffffd8;
  
  in1[1] = (longlong)in_RSI;
  in1[0] = (longlong)in_RDX;
  in1[2] = (longlong)in_RDI;
  in1[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1,in_RCX,in_R8,in_R9,in_stack_ffffffffffffff98);
  in1_00[1] = (longlong)in_RSI;
  in1_00[0] = (longlong)in_RDX;
  in1_00[2] = (longlong)in_RDI;
  in1_00[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_00,in_RCX,in_R8,in_R9,in_stack_ffffffffffffff98);
  in1_01[1] = (longlong)in_RSI;
  in1_01[0] = (longlong)in_RDX;
  in1_01[2] = (longlong)in_RDI;
  in1_01[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_01,in_RCX,in_R8,in_R9,in_stack_ffffffffffffff98);
  lVar1 = in_RDI[3][0];
  lVar3 = in_RDI[3][1];
  lVar5 = in_RDI[3][2];
  palVar7 = (__m256i *)in_RDI[3][3];
  in1_02[1] = (longlong)in_RSI;
  in1_02[0] = (longlong)in_RDX;
  in1_02[2] = (longlong)in_RDI;
  in1_02[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_02,in_RCX,in_R8,in_R9,in_stack_ffffffffffffff98);
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,(int)((ulong)in_R8 >> 0x20));
  lVar2 = lVar1;
  lVar4 = lVar3;
  lVar6 = lVar5;
  palVar8 = palVar7;
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,(int)((ulong)in_R8 >> 0x20));
  in_RDI[0xd][0] = lVar2;
  in_RDI[0xd][1] = lVar4;
  in_RDI[0xd][2] = lVar6;
  in_RDI[0xd][3] = (longlong)palVar7;
  in_RDI[10][0] = lVar1;
  in_RDI[10][1] = lVar3;
  in_RDI[10][2] = lVar5;
  in_RDI[10][3] = (longlong)palVar8;
  clamp_hi_00 = palVar8;
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,(int)((ulong)in_R8 >> 0x20));
  lVar2 = lVar1;
  lVar4 = lVar3;
  lVar6 = lVar5;
  palVar7 = palVar8;
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,(int)((ulong)in_R8 >> 0x20));
  in_RDI[0xc][0] = lVar2;
  in_RDI[0xc][1] = lVar4;
  in_RDI[0xc][2] = lVar6;
  in_RDI[0xc][3] = (longlong)palVar7;
  in_RDI[0xb][0] = lVar1;
  in_RDI[0xb][1] = lVar3;
  in_RDI[0xb][2] = lVar5;
  in_RDI[0xb][3] = (longlong)palVar8;
  in1_03[1] = (longlong)in_RSI;
  in1_03[0] = (longlong)in_RDX;
  in1_03[2] = (longlong)in_RDI;
  in1_03[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_03,in_RCX,in_R8,in_R9,clamp_hi_00);
  in1_04[1] = (longlong)in_RSI;
  in1_04[0] = (longlong)in_RDX;
  in1_04[2] = (longlong)in_RDI;
  in1_04[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_04,in_RCX,in_R8,in_R9,clamp_hi_00);
  in1_05[1] = (longlong)in_RSI;
  in1_05[0] = (longlong)in_RDX;
  in1_05[2] = (longlong)in_RDI;
  in1_05[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_05,in_RCX,in_R8,in_R9,clamp_hi_00);
  in1_06[1] = (longlong)in_RSI;
  in1_06[0] = (longlong)in_RDX;
  in1_06[2] = (longlong)in_RDI;
  in1_06[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_06,in_RCX,in_R8,in_R9,clamp_hi_00);
  in1_07[1] = (longlong)in_RSI;
  in1_07[0] = (longlong)in_RDX;
  in1_07[2] = (longlong)in_RDI;
  in1_07[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_07,in_RCX,in_R8,in_R9,clamp_hi_00);
  in1_08[1] = (longlong)in_RSI;
  in1_08[0] = (longlong)in_RDX;
  in1_08[2] = (longlong)in_RDI;
  in1_08[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_08,in_RCX,in_R8,in_R9,clamp_hi_00);
  in1_09[1] = (longlong)in_RSI;
  in1_09[0] = (longlong)in_RDX;
  in1_09[2] = (longlong)in_RDI;
  in1_09[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_09,in_RCX,in_R8,in_R9,clamp_hi_00);
  in1_10[1] = (longlong)in_RSI;
  in1_10[0] = (longlong)in_RDX;
  in1_10[2] = (longlong)in_RDI;
  in1_10[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_10,in_RCX,in_R8,in_R9,clamp_hi_00);
  return;
}

Assistant:

static inline void idct32_stage7_avx2(__m256i *x, const int32_t *cospi,
                                      const __m256i _r, int8_t cos_bit) {
  const __m256i cospi_m32_p32 = pair_set_w16_epi16(-cospi[32], cospi[32]);
  const __m256i cospi_p32_p32 = pair_set_w16_epi16(cospi[32], cospi[32]);
  btf_16_adds_subs_avx2(&x[0], &x[7]);
  btf_16_adds_subs_avx2(&x[1], &x[6]);
  btf_16_adds_subs_avx2(&x[2], &x[5]);
  btf_16_adds_subs_avx2(&x[3], &x[4]);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[10], &x[13], _r, cos_bit);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[11], &x[12], _r, cos_bit);
  btf_16_adds_subs_avx2(&x[16], &x[23]);
  btf_16_adds_subs_avx2(&x[17], &x[22]);
  btf_16_adds_subs_avx2(&x[18], &x[21]);
  btf_16_adds_subs_avx2(&x[19], &x[20]);
  btf_16_adds_subs_avx2(&x[31], &x[24]);
  btf_16_adds_subs_avx2(&x[30], &x[25]);
  btf_16_adds_subs_avx2(&x[29], &x[26]);
  btf_16_adds_subs_avx2(&x[28], &x[27]);
}